

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepGetLastInnerStepFlag(void *arkode_mem,int *flag)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepGetLastInnerStepFlag",&local_10,&local_18);
  if (iVar1 == 0) {
    *flag = local_18->stepper->last_flag;
  }
  return iVar1;
}

Assistant:

int MRIStepGetLastInnerStepFlag(void* arkode_mem, int* flag)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get the last return value from the inner stepper */
  *flag = step_mem->stepper->last_flag;

  return (ARK_SUCCESS);
}